

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

bool __thiscall
FIX::double_conversion::ComputeGuess
          (double_conversion *this,Vector<const_char> trimmed,int exponent,double *guess)

{
  ulong uVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte bVar4;
  undefined4 in_register_0000000c;
  double *number_of_read_digits;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int requested_exponent;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  DiyFp diy_fp;
  DiyFp input;
  DiyFp cached_power;
  DiyFp local_58;
  DiyFp local_48;
  int local_34;
  
  number_of_read_digits = (double *)CONCAT44(in_register_0000000c,exponent);
  uVar8 = (uint)trimmed.start_;
  if (uVar8 == 0) goto LAB_0016f887;
  uVar6 = trimmed.length_;
  if (0x135 < (int)(uVar6 + uVar8)) {
    *number_of_read_digits = INFINITY;
    return true;
  }
  if ((int)(uVar6 + uVar8) < -0x143) goto LAB_0016f887;
  if (0xf < (int)uVar8) goto LAB_0016f7dc;
  if (((int)uVar6 < 0) && (-0x17 < (int)uVar6)) {
    buffer.start_ = (char *)(ulong)uVar8;
    buffer._8_8_ = &local_58;
    uVar2 = ReadUint64(this,buffer,(int *)number_of_read_digits);
    auVar12._8_4_ = (int)(uVar2 >> 0x20);
    auVar12._0_8_ = uVar2;
    auVar12._12_4_ = 0x45300000;
    dVar11 = (auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    *number_of_read_digits = dVar11;
    if ((uint)local_58.f_ != uVar8) {
      __assert_fail("read_digits == trimmed.length()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0xdc,
                    "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)");
    }
    dVar11 = dVar11 / *(double *)(exact_powers_of_ten + (ulong)-uVar6 * 8);
    goto LAB_0016f7d3;
  }
  if (uVar6 < 0x17) {
    buffer_00.start_ = (char *)(ulong)uVar8;
    buffer_00._8_8_ = &local_58;
    uVar2 = ReadUint64(this,buffer_00,(int *)number_of_read_digits);
    auVar13._8_4_ = (int)(uVar2 >> 0x20);
    auVar13._0_8_ = uVar2;
    auVar13._12_4_ = 0x45300000;
    dVar11 = (auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
    *number_of_read_digits = dVar11;
    if ((uint)local_58.f_ != uVar8) {
      __assert_fail("read_digits == trimmed.length()",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0xe3,
                    "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)");
    }
    uVar3 = (ulong)uVar6;
LAB_0016f7ce:
    dVar11 = dVar11 * *(double *)(exact_powers_of_ten + uVar3 * 8);
LAB_0016f7d3:
    *number_of_read_digits = dVar11;
    return true;
  }
  if (-1 < (int)uVar6) {
    iVar7 = uVar6 - (0xf - uVar8);
    if (iVar7 < 0x17) {
      buffer_01.start_ = (char *)(ulong)uVar8;
      buffer_01._8_8_ = &local_58;
      uVar2 = ReadUint64(this,buffer_01,(int *)number_of_read_digits);
      auVar14._8_4_ = (int)(uVar2 >> 0x20);
      auVar14._0_8_ = uVar2;
      auVar14._12_4_ = 0x45300000;
      dVar11 = (auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
      *number_of_read_digits = dVar11;
      if ((uint)local_58.f_ != uVar8) {
        __assert_fail("read_digits == trimmed.length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xef,
                      "bool FIX::double_conversion::DoubleStrtod(Vector<const char>, int, double *)"
                     );
      }
      dVar11 = dVar11 * *(double *)(exact_powers_of_ten + (long)(int)(0xf - uVar8) * 8);
      *number_of_read_digits = dVar11;
      uVar3 = (ulong)iVar7;
      goto LAB_0016f7ce;
    }
  }
LAB_0016f7dc:
  local_58.f_ = 0;
  local_58.e_ = 0;
  buffer_02.start_ = (char *)(ulong)uVar8;
  buffer_02._8_8_ = &local_48;
  uVar2 = ReadUint64(this,buffer_02,(int *)number_of_read_digits);
  if (uVar8 == (uint)local_48.f_) {
    iVar7 = 0;
    local_58.f_ = uVar2;
  }
  else {
    if (((int)(uint)local_48.f_ < 0) || ((int)uVar8 <= (int)(uint)local_48.f_)) {
      __assert_fail("0 <= index && index < length_",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xcc,
                    "T &FIX::double_conversion::Vector<const char>::operator[](int) const [T = const char]"
                   );
    }
    local_58.f_ = uVar2 + ('4' < (char)this[local_48.f_ & 0xffffffff]);
    iVar7 = uVar8 - (uint)local_48.f_;
  }
  local_58.e_ = 0;
  requested_exponent = uVar6 + iVar7;
  DiyFp::Normalize(&local_58);
  lVar9 = ((ulong)(iVar7 != 0) << 2) << (-(char)local_58.e_ & 0x3fU);
  if (0x154 < requested_exponent) {
    __assert_fail("exponent <= PowersOfTenCache::kMaxDecimalExponent",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                  ,0x129,
                  "bool FIX::double_conversion::DiyFpStrtod(Vector<const char>, int, double *)");
  }
  if (-0x15d < requested_exponent) {
    local_48.f_ = 0;
    local_48.e_ = 0;
    PowersOfTenCache::GetCachedPowerForDecimalExponent(requested_exponent,&local_48,&local_34);
    iVar7 = requested_exponent - local_34;
    if (iVar7 != 0) {
      if (iVar7 == 0 || requested_exponent < local_34) {
        __assert_fail("0 < exponent",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xfc,"DiyFp FIX::double_conversion::AdjustmentPowerOfTen(int)");
      }
      if (7 < iVar7) {
        __assert_fail("exponent < PowersOfTenCache::kDecimalExponentDistance",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                      ,0xfd,"DiyFp FIX::double_conversion::AdjustmentPowerOfTen(int)");
      }
      uVar3 = (local_58.f_ & 0xffffffff) * *(long *)(&DAT_001c8570 + (long)iVar7 * 8);
      local_58.e_ = local_58.e_ + *(int *)(kWhitespaceTable16 + (long)iVar7 * 4 + 0x24);
      local_58.f_ = ((ulong)((uint)uVar3 & 0x80000000) + 0x80000000 >> 0x20) +
                    (uVar3 >> 0x20) +
                    (local_58.f_ >> 0x20) * *(long *)(&DAT_001c8570 + (long)iVar7 * 8);
      if ((int)(0x13 - uVar8) < iVar7) {
        lVar9 = lVar9 + 4;
      }
    }
    uVar5 = (local_48.f_ >> 0x20) * (local_58.f_ & 0xffffffff);
    uVar3 = (local_58.f_ >> 0x20) * (local_48.f_ & 0xffffffff);
    local_58.f_ = ((uVar5 & 0xffffffff) +
                   (uVar3 & 0xffffffff) +
                   ((local_48.f_ & 0xffffffff) * (local_58.f_ & 0xffffffff) >> 0x20) + 0x80000000 >>
                  0x20) + (uVar5 >> 0x20) +
                          (uVar3 >> 0x20) + (local_48.f_ >> 0x20) * (local_58.f_ >> 0x20);
    uVar8 = local_48.e_ + local_58.e_ + 0x40;
    local_58.e_ = uVar8;
    DiyFp::Normalize(&local_58);
    uVar3 = (9 - (ulong)(lVar9 == 0)) + lVar9 << ((char)uVar8 - (char)local_58.e_ & 0x3fU);
    uVar8 = 0;
    if (-0x472 < local_58.e_) {
      uVar8 = local_58.e_ + 0x472;
    }
    uVar5 = 0x35;
    if (local_58.e_ < -0x43d) {
      uVar5 = (ulong)uVar8;
    }
    iVar7 = (int)uVar5;
    if (iVar7 < 4) {
      bVar4 = (byte)(4 - iVar7);
      local_58.f_ = local_58.f_ >> (bVar4 & 0x3f);
      local_58.e_ = (4 - iVar7) + local_58.e_;
      uVar5 = (ulong)(uint)local_58.e_;
      uVar3 = (uVar3 >> (bVar4 & 0x3f)) + 9;
      iVar7 = 0x3c;
    }
    else {
      iVar7 = 0x40 - iVar7;
    }
    if (0x3f < iVar7) {
      __assert_fail("precision_digits_count < 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/strtod.cc"
                    ,0x166,
                    "bool FIX::double_conversion::DiyFpStrtod(Vector<const char>, int, double *)");
    }
    bVar4 = (byte)iVar7;
    lVar9 = 8L << (bVar4 - 1 & 0x3f);
    uVar10 = (~(-1L << (bVar4 & 0x3f)) & local_58.f_) << 3;
    diy_fp.f_ = (ulong)(uint)(iVar7 + local_58.e_);
    uVar1 = uVar3 + lVar9;
    diy_fp._8_8_ = uVar5;
    dVar11 = (double)Double::DiyFpToUint64
                               ((Double *)
                                (((local_58.f_ >> (bVar4 & 0x3f)) + 1) - (ulong)(uVar10 < uVar1)),
                                diy_fp);
    *number_of_read_digits = dVar11;
    if (uVar10 <= lVar9 - uVar3) {
      return true;
    }
    if (uVar10 < uVar1) {
      return INFINITY <= *number_of_read_digits;
    }
    return true;
  }
LAB_0016f887:
  *number_of_read_digits = 0.0;
  return true;
}

Assistant:

static bool ComputeGuess(Vector<const char> trimmed, int exponent,
                         double* guess) {
  if (trimmed.length() == 0) {
    *guess = 0.0;
    return true;
  }
  if (exponent + trimmed.length() - 1 >= kMaxDecimalPower) {
    *guess = Double::Infinity();
    return true;
  }
  if (exponent + trimmed.length() <= kMinDecimalPower) {
    *guess = 0.0;
    return true;
  }

  if (DoubleStrtod(trimmed, exponent, guess) ||
      DiyFpStrtod(trimmed, exponent, guess)) {
    return true;
  }
  if (*guess == Double::Infinity()) {
    return true;
  }
  return false;
}